

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LevenshteinDFA.cpp
# Opt level: O3

void __thiscall
la::LevenshteinDFA::Search
          (LevenshteinDFA *this,trie_tree *trie,int start,trie_node *node,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *output)

{
  size_t *psVar1;
  trie_node *ptVar2;
  long *******ppppppplVar3;
  byte bVar4;
  byte bVar5;
  _Node *p_Var6;
  iterator iVar7;
  _List_node_base *p_Var8;
  mapped_type *pmVar9;
  iterator iVar10;
  long *******ppppppplVar11;
  undefined8 uVar12;
  _List_node_base *p_Var13;
  int i;
  long lVar14;
  bool bVar15;
  pair<int,_char> pair;
  list<char,_std::allocator<char>_> inputs;
  int local_7c;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  trie_tree *local_70;
  key_type local_68;
  _Base_ptr local_60;
  ulong local_58;
  _List_node_base *local_50;
  long *******local_48;
  long *******local_40;
  long local_38;
  
  for (p_Var13 = (this->_finalStates).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                 super__List_node_base._M_next; local_7c = start, local_78 = output, local_70 = trie
      , p_Var13 != (_List_node_base *)&this->_finalStates; p_Var13 = p_Var13->_M_next) {
    if (*(int *)&p_Var13[1]._M_next == start) {
      if ((p_Var13 != (_List_node_base *)&this->_finalStates) && (node->_is_end_word == true)) {
        p_Var6 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                 _M_create_node<std::__cxx11::string&>
                           ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                            output,&node->_value);
        std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
        psVar1 = &(output->
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
      }
      break;
    }
  }
  local_38 = 0;
  local_50 = (_List_node_base *)&this->_uniqueChars;
  p_Var13 = (this->_uniqueChars).super__List_base<char,_std::allocator<char>_>._M_impl._M_node.
            super__List_node_base._M_next;
  local_48 = (long *******)&local_48;
  local_40 = (long *******)&local_48;
  if (p_Var13 != local_50) {
    local_60 = &(this->_transTable)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_58 = (ulong)(uint)start;
    do {
      local_68.second = *(char *)&p_Var13[1]._M_next;
      local_68.first = (int)local_58;
      iVar7 = std::
              _Rb_tree<std::pair<int,_char>,_std::pair<const_std::pair<int,_char>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_char>,_int>_>,_std::less<std::pair<int,_char>_>,_std::allocator<std::pair<const_std::pair<int,_char>,_int>_>_>
              ::find(&(this->_transTable)._M_t,&local_68);
      if (iVar7._M_node != local_60) {
        p_Var8 = (_List_node_base *)operator_new(0x18);
        *(undefined1 *)&p_Var8[1]._M_next = *(undefined1 *)&p_Var13[1]._M_next;
        std::__detail::_List_node_base::_M_hook(p_Var8);
        local_38 = local_38 + 1;
        lVar14 = 0;
        do {
          ptVar2 = (node->_children)._M_elems[lVar14];
          if ((ptVar2 != (trie_node *)0x0) && (ptVar2->_key == *(char *)&p_Var13[1]._M_next)) {
            pmVar9 = std::
                     map<std::pair<int,_char>,_int,_std::less<std::pair<int,_char>_>,_std::allocator<std::pair<const_std::pair<int,_char>,_int>_>_>
                     ::at(&this->_transTable,&local_68);
            Search(this,local_70,*pmVar9,(node->_children)._M_elems[lVar14],local_78);
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0x28);
      }
      p_Var13 = p_Var13->_M_next;
    } while (p_Var13 != local_50);
  }
  iVar10 = std::
           _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&(this->_defaultTrans)._M_h,&local_7c);
  ppppppplVar11 = local_48;
  if (iVar10.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur !=
      (__node_type *)0x0) {
    lVar14 = 0;
    do {
      ptVar2 = (node->_children)._M_elems[lVar14];
      if (ptVar2 != (trie_node *)0x0) {
        if ((long ********)local_48 != &local_48) {
          ppppppplVar11 = local_48;
          bVar5 = 0;
          do {
            bVar4 = bVar5;
            bVar15 = *(char *)(ppppppplVar11 + 2) == ptVar2->_key;
            ppppppplVar11 = (long *******)*ppppppplVar11;
            bVar5 = bVar4 | bVar15;
          } while ((long ********)ppppppplVar11 != &local_48);
          if ((bool)(bVar4 | bVar15)) goto LAB_00107060;
        }
        iVar10 = std::
                 _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->_defaultTrans)._M_h,&local_7c);
        if (iVar10.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur ==
            (__node_type *)0x0) {
          uVar12 = std::__throw_out_of_range("_Map_base::at");
          ppppppplVar11 = local_48;
          while ((long ********)ppppppplVar11 != &local_48) {
            ppppppplVar3 = (long *******)*ppppppplVar11;
            operator_delete(ppppppplVar11,0x18);
            ppppppplVar11 = ppppppplVar3;
          }
          _Unwind_Resume(uVar12);
        }
        Search(this,local_70,
               *(int *)((long)iVar10.super__Node_iterator_base<std::pair<const_int,_int>,_false>.
                              _M_cur + 0xc),(node->_children)._M_elems[lVar14],local_78);
      }
LAB_00107060:
      lVar14 = lVar14 + 1;
      ppppppplVar11 = local_48;
    } while (lVar14 != 0x28);
  }
  while ((long ********)ppppppplVar11 != &local_48) {
    ppppppplVar3 = (long *******)*ppppppplVar11;
    operator_delete(ppppppplVar11,0x18);
    ppppppplVar11 = ppppppplVar3;
  }
  return;
}

Assistant:

void LevenshteinDFA::Search(const trie_tree &trie, int start, trie_node * node, std::list<std::string> &output)
    {
        /**/
        if (std::find(_finalStates.begin(), _finalStates.end(), start) != _finalStates.end() &&node->_is_end_word )
        {
            output.emplace_back(node->_value);
        }
        std::list<char> inputs;
        for (std::list<char>::iterator it = _uniqueChars.begin(); it != _uniqueChars.end();++it)
        {
            std::pair<int, char> pair = std::make_pair(start, *it);
            auto it2 = _transTable.find(pair);
            if (it2 != _transTable.end())
            {
                inputs.emplace_back(*it);
                for (int i = 0; i < trie_node::ALPHABET_SIZE; ++i)
                {
                    if (node->_children[i] == NULL)
                        continue;
                    if (node->_children[i]->_key == *it)
                    {
                        Search(trie, _transTable.at(pair), node->_children[i], output);
                    }
                }
            }
        }
        auto it = _defaultTrans.find(start);
        if (it != _defaultTrans.end())
        {
            for (int i = 0; i < trie_node::ALPHABET_SIZE; ++i)
            {
                bool found = false;;
                if (node->_children[i] == NULL) continue;
                for (std::list<char>::iterator it = inputs.begin(); it != inputs.end();++it)
                {
                    if (*it == node->_children[i]->_key)
                    {
                        found = true;
                    }
                }
                if (!found)
                {
                    Search(trie, _defaultTrans.at(start), node->_children[i], output);
                }
            }
        }

    }